

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

pair<llvm::StringMapIterator<bool>,_bool> __thiscall
llvm::StringMap<bool,_llvm::MallocAllocator>::try_emplace<>
          (StringMap<bool,_llvm::MallocAllocator> *this,StringRef Key)

{
  StringMapEntryBase **ppSVar1;
  int iVar2;
  uint uVar3;
  StringMapEntryBase *pSVar4;
  StringMapEntry<bool> *pSVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_> SVar7;
  pair<llvm::StringMapIterator<bool>,_bool> pVar8;
  
  uVar3 = StringMapImpl::LookupBucketFor((StringMapImpl *)this,Key);
  SVar7.Ptr = (StringMapEntryBase **)(*(long *)this + (ulong)uVar3 * 8);
  pSVar4 = *SVar7.Ptr;
  if (pSVar4 == (StringMapEntryBase *)0xfffffffffffffff8) {
    *(int *)(this + 0x10) = *(int *)(this + 0x10) + -1;
  }
  else if (pSVar4 != (StringMapEntryBase *)0x0) {
    while ((pSVar4 == (StringMapEntryBase *)0x0 ||
           (pSVar4 == (StringMapEntryBase *)0xfffffffffffffff8))) {
      ppSVar1 = SVar7.Ptr + 1;
      SVar7.Ptr = SVar7.Ptr + 1;
      pSVar4 = *ppSVar1;
    }
    uVar6 = 0;
    goto LAB_00153b5b;
  }
  pSVar5 = StringMapEntry<bool>::Create<llvm::MallocAllocator>(Key,(MallocAllocator *)(this + 0x18))
  ;
  *SVar7.Ptr = &pSVar5->super_StringMapEntryBase;
  iVar2 = *(int *)(this + 0xc);
  *(int *)(this + 0xc) = iVar2 + 1;
  if (*(uint *)(this + 8) < (uint)(iVar2 + 1 + *(int *)(this + 0x10))) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<bool>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = bool, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar3 = StringMapImpl::RehashTable((StringMapImpl *)this,uVar3);
  for (SVar7.Ptr = (StringMapEntryBase **)((ulong)uVar3 * 8 + *(long *)this);
      (*SVar7.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar7.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar7.Ptr = SVar7.Ptr + 1) {
  }
  uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00153b5b:
  pVar8._8_8_ = uVar6;
  pVar8.first.super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
  Ptr = (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)
        (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)SVar7.Ptr;
  return pVar8;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }